

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::LineRenderCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 local_190 [8];
  ostringstream buf;
  LineRenderCase *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 vtx_color;\nuniform highp vec4 u_posScale;\nuniform highp float u_lineWidth;\n\n"
                 );
  if ((*(byte *)((long)this + 0x80) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)local_190,
                             "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n\nflat out highp float v_"
                            );
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_expansionSize;\nflat out highp vec3 v_");
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,"bbox_clipMax;\n\n");
  }
  std::operator<<((ostream *)local_190,
                  "void main()\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\tgl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n\tvtx_color = a_color;\n"
                 );
  if ((*(byte *)((long)this + 0x80) & 1) == 0) {
    poVar1 = std::operator<<((ostream *)local_190,"\n\tv_");
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_expansionSize = u_lineWidth;\n\tv_");
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,
                             "bbox_clipMin =\n\t    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n\tv_"
                            );
    pcVar2 = "";
    if ((*(byte *)((long)this + 0x81) & 1) != 0) {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,
                    "bbox_clipMax =\n\t    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n"
                   );
  }
  std::operator<<((ostream *)local_190,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string LineRenderCase::genVertexSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n"
			"in highp vec4 a_color;\n"
			"out highp vec4 vtx_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"uniform highp float u_lineWidth;\n"
			"\n";
	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n"
				"\n"
				"flat out highp float v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
				"\n";
	}
	buf <<	"void main()\n"
			"{\n"
			"	highp vec2 patternOffset = u_posScale.xy;\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	gl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n"
			"	vtx_color = a_color;\n";
	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize = u_lineWidth;\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin =\n"
				"	    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax =\n"
				"	    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n";
	}
	buf <<	"}\n";

	return buf.str();
}